

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O2

bool __thiscall Path::executable(Path *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  string *__return_storage_ptr__;
  char *args_1;
  allocator<char> local_41;
  string local_40;
  
  bVar1 = exists(this);
  if (bVar1) {
    iVar2 = access((this->_data)._M_dataplus._M_p,1);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0xd) {
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"access error {1}: {2}",&local_41);
        iVar2 = *piVar3;
        args_1 = strerror(iVar2);
        format<int,char*>(__return_storage_ptr__,&local_40,iVar2,args_1);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
    }
    bVar1 = iVar2 == 0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Path::executable () const
{
  if (! exists ())
    return false;

  auto status = access (_data.c_str (), X_OK);
  if (status == -1 && errno != EACCES)
    throw format ("access error {1}: {2}", errno, strerror (errno));

  return status == 0;
}